

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::dart_thrift_imports_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this)

{
  t_program *ptVar1;
  pointer pptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string named_import;
  string include_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_160,"import \'dart:typed_data\' show Uint8List;",&::endl_abi_cxx11_);
  std::operator+(&local_120,&local_160,"import \'package:thrift/thrift.dart\';");
  std::operator+(__return_storage_ptr__,&local_120,&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_160);
  local_c0 = &this->package_prefix_;
  if ((this->package_prefix_)._M_string_length == 0) {
    std::operator+(&local_e0,"import \'package:",&this->library_name_);
    std::operator+(&local_140,&local_e0,"/");
    std::operator+(&local_100,&local_140,&this->library_name_);
    std::operator+(&local_160,&local_100,".dart\';");
    std::operator+(&local_120,&local_160,&::endl_abi_cxx11_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_140);
    pbVar3 = &local_e0;
  }
  else {
    std::operator+(&local_140,"import \'package:",local_c0);
    std::operator+(&local_100,&local_140,&this->library_name_);
    std::operator+(&local_160,&local_100,".dart\';");
    std::operator+(&local_120,&local_160,&::endl_abi_cxx11_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_100);
    pbVar3 = &local_140;
  }
  std::__cxx11::string::~string((string *)pbVar3);
  ptVar1 = (this->super_t_oop_generator).super_t_generator.program_;
  local_b8 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar2 != local_b8;
      pptVar2 = pptVar2 + 1) {
    find_library_name_abi_cxx11_(&local_120,this,*pptVar2);
    std::operator+(&local_160,"t_",&local_120);
    if ((this->package_prefix_)._M_string_length == 0) {
      std::operator+(&local_50,"import \'package:",&local_120);
      std::operator+(&local_b0,&local_50,"/");
      std::operator+(&local_90,&local_b0,&local_120);
      std::operator+(&local_70,&local_90,".dart\' as ");
      std::operator+(&local_e0,&local_70,&local_160);
      std::operator+(&local_140,&local_e0,";");
      std::operator+(&local_100,&local_140,&::endl_abi_cxx11_);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      pbVar3 = &local_50;
    }
    else {
      std::operator+(&local_b0,"import \'package:",local_c0);
      std::operator+(&local_90,&local_b0,&local_120);
      std::operator+(&local_70,&local_90,".dart\' as ");
      std::operator+(&local_e0,&local_70,&local_160);
      std::operator+(&local_140,&local_e0,";");
      std::operator+(&local_100,&local_140,&::endl_abi_cxx11_);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      pbVar3 = &local_b0;
    }
    std::__cxx11::string::~string((string *)pbVar3);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::dart_thrift_imports() {
  string imports = "import 'dart:typed_data' show Uint8List;" + endl +
                   "import 'package:thrift/thrift.dart';" + endl;

  // add import for this library
  if (package_prefix_.empty()) {
    imports += "import 'package:" + library_name_ + "/" + library_name_ + ".dart';" + endl;
  } else {
    imports += "import 'package:" + package_prefix_ + library_name_ + ".dart';" + endl;
  }

  // add imports for included thrift files
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    string include_name = find_library_name(include);
    string named_import = "t_" + include_name;
    if (package_prefix_.empty()) {
      imports += "import 'package:" + include_name + "/" + include_name + ".dart' as " + named_import + ";" + endl;
    } else {
      imports += "import 'package:" + package_prefix_ + include_name + ".dart' as " + named_import + ";" + endl;
    }
  }

  return imports;
}